

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O2

void WebRtcIsac_AllZeroFilter(double *In,double *Coef,size_t lengthInOut,int orderCoef,double *Out)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)orderCoef;
  if (orderCoef < 1) {
    uVar2 = uVar1;
  }
  for (; uVar1 != lengthInOut; uVar1 = uVar1 + 1) {
    dVar5 = *In * *Coef;
    pdVar3 = Coef + 1;
    for (lVar4 = 0; -lVar4 != uVar2; lVar4 = lVar4 + -1) {
      dVar5 = dVar5 + *pdVar3 * In[lVar4 + -1];
      pdVar3 = pdVar3 + 1;
    }
    *Out = dVar5;
    Out = Out + 1;
    In = In + 1;
  }
  return;
}

Assistant:

void WebRtcIsac_AllZeroFilter(double* In,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef,
                              double* Out) {
  /* the state of filter is assumed to be in In[-1] to In[-orderCoef] */

  size_t n;
  int k;
  double tmp;

  for(n = 0; n < lengthInOut; n++)
  {
    tmp = In[0] * Coef[0];

    for(k = 1; k <= orderCoef; k++){
      tmp += Coef[k] * In[-k];
    }

    *Out++ = tmp;
    In++;
  }
}